

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void yy_syntax_error(yyParser *yypParser,int yymajor,Token yyminor)

{
  Parse *pParse_00;
  Parse *pParse;
  int yymajor_local;
  yyParser *yypParser_local;
  Token yyminor_local;
  
  yypParser_local = (yyParser *)yyminor.z;
  yyminor_local.z._0_4_ = yyminor.n;
  pParse_00 = yypParser->pParse;
  if (*(char *)&yypParser_local->yytos == '\0') {
    sqlite3ErrorMsg(pParse_00,"incomplete input");
  }
  else {
    sqlite3ErrorMsg(pParse_00,"near \"%T\": syntax error",&yypParser_local);
  }
  yypParser->pParse = pParse_00;
  return;
}

Assistant:

static void yy_syntax_error(
  yyParser *yypParser,           /* The parser */
  int yymajor,                   /* The major type of the error token */
  sqlite3ParserTOKENTYPE yyminor         /* The minor type of the error token */
){
  sqlite3ParserARG_FETCH
  sqlite3ParserCTX_FETCH
#define TOKEN yyminor
/************ Begin %syntax_error code ****************************************/

  UNUSED_PARAMETER(yymajor);  /* Silence some compiler warnings */
  if( TOKEN.z[0] ){
    sqlite3ErrorMsg(pParse, "near \"%T\": syntax error", &TOKEN);
  }else{
    sqlite3ErrorMsg(pParse, "incomplete input");
  }
/************ End %syntax_error code ******************************************/
  sqlite3ParserARG_STORE /* Suppress warning about unused %extra_argument variable */
  sqlite3ParserCTX_STORE
}